

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  size_t k;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [28];
  int iVar49;
  float *vertices;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  undefined1 (*pauVar53) [32];
  ulong uVar54;
  Geometry *pGVar55;
  ulong uVar56;
  Geometry *pGVar57;
  ulong *puVar58;
  NodeRef root;
  undefined4 uVar59;
  Geometry *unaff_R15;
  bool bVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar64;
  float fVar65;
  float fVar83;
  float fVar85;
  undefined1 auVar66 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar84;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar92 [32];
  float fVar97;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  float fVar135;
  undefined1 auVar136 [32];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar137 [64];
  undefined1 auVar144 [32];
  Precalculations pre;
  vuint<4> *v;
  vbool<8> terminated;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2d39;
  RayK<8> *local_2d38;
  ulong local_2d30;
  RayQueryContext *local_2d28;
  undefined1 local_2d20 [8];
  undefined1 auStack_2d18 [8];
  float fStack_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  RayK<8> *local_2ce8;
  undefined1 local_2ce0 [32];
  BVH *local_2cc0;
  Intersectors *local_2cb8;
  Scene *local_2cb0;
  long local_2ca8;
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [32];
  RTCFilterFunctionNArguments local_2c30;
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 local_2b90;
  undefined8 uStack_2b88;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2b80;
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [8];
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  undefined1 local_2aa0 [8];
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [8];
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  undefined1 local_28c0 [8];
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  float local_2860;
  float fStack_285c;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  undefined4 uStack_2844;
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar78 [32];
  
  local_2cc0 = (BVH *)This->ptr;
  local_2608 = (local_2cc0->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar74 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar66 = ZEXT816(0) << 0x40;
      auVar79 = vpcmpeqd_avx2(auVar74,(undefined1  [32])valid_i->field_0);
      auVar74 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar66),5);
      auVar67 = auVar79 & auVar74;
      if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar67 >> 0x7f,0) != '\0') ||
            (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar67 >> 0xbf,0) != '\0') ||
          (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar67[0x1f] < '\0') {
        auVar74 = vandps_avx(auVar74,auVar79);
        auVar16 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
        local_2b80._0_8_ = *(undefined8 *)ray;
        local_2b80._8_8_ = *(undefined8 *)(ray + 8);
        local_2b80._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2b80._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2b80._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2b80._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2b80._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2b80._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2b80._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2b80._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2b80._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2b80._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2b20 = *(undefined1 (*) [32])(ray + 0x80);
        local_2b00 = *(undefined1 (*) [32])(ray + 0xa0);
        local_28a0._8_4_ = 0x7fffffff;
        local_28a0._0_8_ = 0x7fffffff7fffffff;
        local_28a0._12_4_ = 0x7fffffff;
        local_28a0._16_4_ = 0x7fffffff;
        local_28a0._20_4_ = 0x7fffffff;
        local_28a0._24_4_ = 0x7fffffff;
        local_28a0._28_4_ = 0x7fffffff;
        auVar101._8_4_ = 0x219392ef;
        auVar101._0_8_ = 0x219392ef219392ef;
        auVar101._12_4_ = 0x219392ef;
        auVar101._16_4_ = 0x219392ef;
        auVar101._20_4_ = 0x219392ef;
        auVar101._24_4_ = 0x219392ef;
        auVar101._28_4_ = 0x219392ef;
        auVar124 = ZEXT3264(auVar101);
        auVar78._8_4_ = 0x3f800000;
        auVar78._0_8_ = 0x3f8000003f800000;
        auVar78._12_4_ = 0x3f800000;
        auVar78._16_4_ = 0x3f800000;
        auVar78._20_4_ = 0x3f800000;
        auVar78._24_4_ = 0x3f800000;
        auVar78._28_4_ = 0x3f800000;
        local_2ae0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar102 = vdivps_avx(auVar78,local_2b20);
        auVar74 = vandps_avx(local_28a0,local_2b20);
        auVar67 = vcmpps_avx(auVar74,auVar101,1);
        auVar74 = vandps_avx(local_28a0,local_2b00);
        auVar79 = vcmpps_avx(auVar74,auVar101,1);
        auVar106 = vdivps_avx(auVar78,local_2b00);
        auVar74 = vandps_avx(local_28a0,local_2ae0);
        auVar121._8_4_ = 0x5d5e0b6b;
        auVar121._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar121._12_4_ = 0x5d5e0b6b;
        auVar121._16_4_ = 0x5d5e0b6b;
        auVar121._20_4_ = 0x5d5e0b6b;
        auVar121._24_4_ = 0x5d5e0b6b;
        auVar121._28_4_ = 0x5d5e0b6b;
        _local_2ac0 = vblendvps_avx(auVar102,auVar121,auVar67);
        auVar74 = vcmpps_avx(auVar74,auVar101,1);
        auVar67 = vdivps_avx(auVar78,local_2ae0);
        auVar119 = ZEXT3264(auVar67);
        _local_2aa0 = vblendvps_avx(auVar106,auVar121,auVar79);
        local_2a80 = vblendvps_avx(auVar67,auVar121,auVar74);
        auVar114 = ZEXT3264(local_2a80);
        auVar74 = vcmpps_avx(_local_2ac0,ZEXT1632(auVar66),1);
        auVar106._8_4_ = 0x10;
        auVar106._0_8_ = 0x1000000010;
        auVar106._12_4_ = 0x10;
        auVar106._16_4_ = 0x10;
        auVar106._20_4_ = 0x10;
        auVar106._24_4_ = 0x10;
        auVar106._28_4_ = 0x10;
        local_2a60 = vandps_avx(auVar74,auVar106);
        auVar67 = ZEXT1632(auVar66);
        auVar74 = vcmpps_avx(_local_2aa0,auVar67,5);
        auVar79._8_4_ = 0x20;
        auVar79._0_8_ = 0x2000000020;
        auVar79._12_4_ = 0x20;
        auVar79._16_4_ = 0x20;
        auVar79._20_4_ = 0x20;
        auVar79._24_4_ = 0x20;
        auVar79._28_4_ = 0x20;
        auVar107._8_4_ = 0x30;
        auVar107._0_8_ = 0x3000000030;
        auVar107._12_4_ = 0x30;
        auVar107._16_4_ = 0x30;
        auVar107._20_4_ = 0x30;
        auVar107._24_4_ = 0x30;
        auVar107._28_4_ = 0x30;
        local_2a40 = vblendvps_avx(auVar107,auVar79,auVar74);
        auVar74 = vcmpps_avx(local_2a80,auVar67,5);
        auVar102._8_4_ = 0x40;
        auVar102._0_8_ = 0x4000000040;
        auVar102._12_4_ = 0x40;
        auVar102._16_4_ = 0x40;
        auVar102._20_4_ = 0x40;
        auVar102._24_4_ = 0x40;
        auVar102._28_4_ = 0x40;
        auVar80._8_4_ = 0x50;
        auVar80._0_8_ = 0x5000000050;
        auVar80._12_4_ = 0x50;
        auVar80._16_4_ = 0x50;
        auVar80._20_4_ = 0x50;
        auVar80._24_4_ = 0x50;
        auVar80._28_4_ = 0x50;
        local_2a20 = vblendvps_avx(auVar80,auVar102,auVar74);
        auVar74 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar67);
        local_29c0 = vpmovsxwd_avx2(auVar16);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar133 = ZEXT3264(local_1e80);
        local_2a00 = vblendvps_avx(local_1e80,auVar74,local_29c0);
        auVar74 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar67);
        auVar67._8_4_ = 0xff800000;
        auVar67._0_8_ = 0xff800000ff800000;
        auVar67._12_4_ = 0xff800000;
        auVar67._16_4_ = 0xff800000;
        auVar67._20_4_ = 0xff800000;
        auVar67._24_4_ = 0xff800000;
        auVar67._28_4_ = 0xff800000;
        local_29e0 = vblendvps_avx(auVar67,auVar74,local_29c0);
        auVar66 = vpcmpeqd_avx(local_29e0._0_16_,local_29e0._0_16_);
        local_2c60 = vpmovsxwd_avx2(auVar16 ^ auVar66);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar56 = 5;
        }
        else {
          uVar56 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2ce8 = ray + 0x100;
        puVar58 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar53 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_2a00;
        auVar134 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar137 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        local_2d38 = ray;
        local_2d30 = uVar56;
        local_2d28 = context;
        local_2cb8 = This;
LAB_019cd96c:
        do {
          do {
            root.ptr = puVar58[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_019ce532;
            puVar58 = puVar58 + -1;
            pauVar53 = pauVar53 + -1;
            _local_2d20 = *pauVar53;
            auVar82 = ZEXT3264(_local_2d20);
            auVar74 = vcmpps_avx(_local_2d20,local_29e0,1);
          } while ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar74 >> 0x7f,0) == '\0') &&
                     (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar74 >> 0xbf,0) == '\0') &&
                   (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar74[0x1f]);
          uVar59 = vmovmskps_avx(auVar74);
          unaff_R15 = (Geometry *)CONCAT44((int)((ulong)unaff_R15 >> 0x20),uVar59);
          if (uVar56 < (uint)POPCOUNT(uVar59)) {
LAB_019cd9aa:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_019ce532;
                auVar67 = auVar82._0_32_;
                auVar74 = vcmpps_avx(local_29e0,auVar67,6);
                if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar74 >> 0x7f,0) == '\0') &&
                      (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar74 >> 0xbf,0) == '\0') &&
                    (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar74[0x1f]) goto LAB_019cd96c;
                pGVar55 = (Geometry *)((ulong)((uint)root.ptr & 0xf) - 8);
                if (pGVar55 == (Geometry *)0x0) {
                  auVar74 = vpcmpeqd_avx2(auVar67,auVar67);
                  auVar67 = local_2c60;
                  goto LAB_019ce416;
                }
                local_29a0 = local_2c60;
                auVar75._0_8_ = local_2c60._0_8_ ^ 0xffffffffffffffff;
                auVar75._8_4_ = local_2c60._8_4_ ^ 0xffffffff;
                auVar75._12_4_ = local_2c60._12_4_ ^ 0xffffffff;
                auVar75._16_4_ = local_2c60._16_4_ ^ 0xffffffff;
                auVar75._20_4_ = local_2c60._20_4_ ^ 0xffffffff;
                auVar75._24_4_ = local_2c60._24_4_ ^ 0xffffffff;
                auVar75._28_4_ = local_2c60._28_4_ ^ 0xffffffff;
                lVar51 = (root.ptr & 0xfffffffffffffff0) + 0x40;
                pGVar57 = (Geometry *)0x0;
                goto LAB_019cdba0;
              }
              uVar54 = 8;
              lVar51 = 0;
              auVar74 = auVar133._0_32_;
              do {
                uVar50 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar51 * 8);
                if (uVar50 == 8) {
                  auVar82 = ZEXT3264(auVar74);
                  break;
                }
                uVar59 = *(undefined4 *)(root.ptr + 0x20 + lVar51 * 4);
                auVar68._4_4_ = uVar59;
                auVar68._0_4_ = uVar59;
                auVar68._8_4_ = uVar59;
                auVar68._12_4_ = uVar59;
                auVar68._16_4_ = uVar59;
                auVar68._20_4_ = uVar59;
                auVar68._24_4_ = uVar59;
                auVar68._28_4_ = uVar59;
                auVar44._8_8_ = local_2b80._8_8_;
                auVar44._0_8_ = local_2b80._0_8_;
                auVar44._16_8_ = local_2b80._16_8_;
                auVar44._24_8_ = local_2b80._24_8_;
                auVar45._8_8_ = local_2b80._40_8_;
                auVar45._0_8_ = local_2b80._32_8_;
                auVar45._16_8_ = local_2b80._48_8_;
                auVar45._24_8_ = local_2b80._56_8_;
                auVar46._8_8_ = local_2b80._72_8_;
                auVar46._0_8_ = local_2b80._64_8_;
                auVar46._16_8_ = local_2b80._80_8_;
                auVar46._24_8_ = local_2b80._88_8_;
                auVar67 = vsubps_avx(auVar68,auVar44);
                auVar82._0_4_ = (float)local_2ac0._0_4_ * auVar67._0_4_;
                auVar82._4_4_ = (float)local_2ac0._4_4_ * auVar67._4_4_;
                auVar82._8_4_ = fStack_2ab8 * auVar67._8_4_;
                auVar82._12_4_ = fStack_2ab4 * auVar67._12_4_;
                auVar82._16_4_ = fStack_2ab0 * auVar67._16_4_;
                auVar82._20_4_ = fStack_2aac * auVar67._20_4_;
                auVar82._28_36_ = auVar114._28_36_;
                auVar82._24_4_ = fStack_2aa8 * auVar67._24_4_;
                auVar102 = auVar82._0_32_;
                auVar114 = ZEXT3264(auVar102);
                uVar59 = *(undefined4 *)(root.ptr + 0x40 + lVar51 * 4);
                auVar69._4_4_ = uVar59;
                auVar69._0_4_ = uVar59;
                auVar69._8_4_ = uVar59;
                auVar69._12_4_ = uVar59;
                auVar69._16_4_ = uVar59;
                auVar69._20_4_ = uVar59;
                auVar69._24_4_ = uVar59;
                auVar69._28_4_ = uVar59;
                auVar67 = vsubps_avx(auVar69,auVar45);
                auVar120._0_4_ = (float)local_2aa0._0_4_ * auVar67._0_4_;
                auVar120._4_4_ = (float)local_2aa0._4_4_ * auVar67._4_4_;
                auVar120._8_4_ = fStack_2a98 * auVar67._8_4_;
                auVar120._12_4_ = fStack_2a94 * auVar67._12_4_;
                auVar120._16_4_ = fStack_2a90 * auVar67._16_4_;
                auVar120._20_4_ = fStack_2a8c * auVar67._20_4_;
                auVar120._28_36_ = auVar119._28_36_;
                auVar120._24_4_ = fStack_2a88 * auVar67._24_4_;
                auVar106 = auVar120._0_32_;
                auVar119 = ZEXT3264(auVar106);
                uVar59 = *(undefined4 *)(root.ptr + 0x60 + lVar51 * 4);
                auVar70._4_4_ = uVar59;
                auVar70._0_4_ = uVar59;
                auVar70._8_4_ = uVar59;
                auVar70._12_4_ = uVar59;
                auVar70._16_4_ = uVar59;
                auVar70._20_4_ = uVar59;
                auVar70._24_4_ = uVar59;
                auVar70._28_4_ = uVar59;
                auVar67 = vsubps_avx(auVar70,auVar46);
                auVar125._0_4_ = local_2a80._0_4_ * auVar67._0_4_;
                auVar125._4_4_ = local_2a80._4_4_ * auVar67._4_4_;
                auVar125._8_4_ = local_2a80._8_4_ * auVar67._8_4_;
                auVar125._12_4_ = local_2a80._12_4_ * auVar67._12_4_;
                auVar125._16_4_ = local_2a80._16_4_ * auVar67._16_4_;
                auVar125._20_4_ = local_2a80._20_4_ * auVar67._20_4_;
                auVar125._28_36_ = auVar124._28_36_;
                auVar125._24_4_ = local_2a80._24_4_ * auVar67._24_4_;
                auVar107 = auVar125._0_32_;
                auVar124 = ZEXT3264(auVar107);
                uVar59 = *(undefined4 *)(root.ptr + 0x30 + lVar51 * 4);
                auVar71._4_4_ = uVar59;
                auVar71._0_4_ = uVar59;
                auVar71._8_4_ = uVar59;
                auVar71._12_4_ = uVar59;
                auVar71._16_4_ = uVar59;
                auVar71._20_4_ = uVar59;
                auVar71._24_4_ = uVar59;
                auVar71._28_4_ = uVar59;
                auVar67 = vsubps_avx(auVar71,auVar44);
                auVar21._4_4_ = (float)local_2ac0._4_4_ * auVar67._4_4_;
                auVar21._0_4_ = (float)local_2ac0._0_4_ * auVar67._0_4_;
                auVar21._8_4_ = fStack_2ab8 * auVar67._8_4_;
                auVar21._12_4_ = fStack_2ab4 * auVar67._12_4_;
                auVar21._16_4_ = fStack_2ab0 * auVar67._16_4_;
                auVar21._20_4_ = fStack_2aac * auVar67._20_4_;
                auVar21._24_4_ = fStack_2aa8 * auVar67._24_4_;
                auVar21._28_4_ = (int)((ulong)local_2b80._24_8_ >> 0x20);
                uVar59 = *(undefined4 *)(root.ptr + 0x50 + lVar51 * 4);
                auVar72._4_4_ = uVar59;
                auVar72._0_4_ = uVar59;
                auVar72._8_4_ = uVar59;
                auVar72._12_4_ = uVar59;
                auVar72._16_4_ = uVar59;
                auVar72._20_4_ = uVar59;
                auVar72._24_4_ = uVar59;
                auVar72._28_4_ = uVar59;
                auVar67 = vsubps_avx(auVar72,auVar45);
                auVar22._4_4_ = (float)local_2aa0._4_4_ * auVar67._4_4_;
                auVar22._0_4_ = (float)local_2aa0._0_4_ * auVar67._0_4_;
                auVar22._8_4_ = fStack_2a98 * auVar67._8_4_;
                auVar22._12_4_ = fStack_2a94 * auVar67._12_4_;
                auVar22._16_4_ = fStack_2a90 * auVar67._16_4_;
                auVar22._20_4_ = fStack_2a8c * auVar67._20_4_;
                auVar22._24_4_ = fStack_2a88 * auVar67._24_4_;
                auVar22._28_4_ = (int)((ulong)local_2b80._56_8_ >> 0x20);
                uVar59 = *(undefined4 *)(root.ptr + 0x70 + lVar51 * 4);
                auVar73._4_4_ = uVar59;
                auVar73._0_4_ = uVar59;
                auVar73._8_4_ = uVar59;
                auVar73._12_4_ = uVar59;
                auVar73._16_4_ = uVar59;
                auVar73._20_4_ = uVar59;
                auVar73._24_4_ = uVar59;
                auVar73._28_4_ = uVar59;
                auVar67 = vsubps_avx(auVar73,auVar46);
                auVar23._4_4_ = local_2a80._4_4_ * auVar67._4_4_;
                auVar23._0_4_ = local_2a80._0_4_ * auVar67._0_4_;
                auVar23._8_4_ = local_2a80._8_4_ * auVar67._8_4_;
                auVar23._12_4_ = local_2a80._12_4_ * auVar67._12_4_;
                auVar23._16_4_ = local_2a80._16_4_ * auVar67._16_4_;
                auVar23._20_4_ = local_2a80._20_4_ * auVar67._20_4_;
                auVar23._24_4_ = local_2a80._24_4_ * auVar67._24_4_;
                auVar23._28_4_ = (int)((ulong)local_2b80._88_8_ >> 0x20);
                auVar67 = vminps_avx(auVar102,auVar21);
                auVar79 = vminps_avx(auVar106,auVar22);
                auVar67 = vmaxps_avx(auVar67,auVar79);
                auVar79 = vminps_avx(auVar107,auVar23);
                auVar67 = vmaxps_avx(auVar67,auVar79);
                auVar24._4_4_ = auVar134._4_4_ * auVar67._4_4_;
                auVar24._0_4_ = auVar134._0_4_ * auVar67._0_4_;
                auVar24._8_4_ = auVar134._8_4_ * auVar67._8_4_;
                auVar24._12_4_ = auVar134._12_4_ * auVar67._12_4_;
                auVar24._16_4_ = auVar134._16_4_ * auVar67._16_4_;
                auVar24._20_4_ = auVar134._20_4_ * auVar67._20_4_;
                auVar24._24_4_ = auVar134._24_4_ * auVar67._24_4_;
                auVar24._28_4_ = auVar67._28_4_;
                auVar67 = vmaxps_avx(auVar102,auVar21);
                auVar79 = vmaxps_avx(auVar106,auVar22);
                auVar79 = vminps_avx(auVar67,auVar79);
                auVar67 = vmaxps_avx(auVar107,auVar23);
                auVar67 = vminps_avx(auVar79,auVar67);
                auVar25._4_4_ = auVar137._4_4_ * auVar67._4_4_;
                auVar25._0_4_ = auVar137._0_4_ * auVar67._0_4_;
                auVar25._8_4_ = auVar137._8_4_ * auVar67._8_4_;
                auVar25._12_4_ = auVar137._12_4_ * auVar67._12_4_;
                auVar25._16_4_ = auVar137._16_4_ * auVar67._16_4_;
                auVar25._20_4_ = auVar137._20_4_ * auVar67._20_4_;
                auVar25._24_4_ = auVar137._24_4_ * auVar67._24_4_;
                auVar25._28_4_ = auVar67._28_4_;
                auVar67 = vmaxps_avx(auVar24,local_2a00);
                auVar79 = vminps_avx(auVar25,local_29e0);
                auVar67 = vcmpps_avx(auVar67,auVar79,2);
                if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar67 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar67 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar67 >> 0x7f,0) == '\0') &&
                      (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar67 >> 0xbf,0) == '\0') &&
                    (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar67[0x1f]) {
                  auVar82 = ZEXT3264(auVar74);
                  uVar50 = uVar54;
                }
                else {
                  auVar67 = vblendvps_avx(auVar133._0_32_,auVar24,auVar67);
                  auVar82 = ZEXT3264(auVar67);
                  if (uVar54 != 8) {
                    *puVar58 = uVar54;
                    puVar58 = puVar58 + 1;
                    *pauVar53 = auVar74;
                    pauVar53 = pauVar53 + 1;
                  }
                }
                uVar54 = uVar50;
                lVar51 = lVar51 + 1;
                auVar74 = auVar82._0_32_;
              } while (lVar51 != 4);
              iVar49 = 4;
              if (uVar54 == 8) goto LAB_019cdb31;
              auVar74 = vcmpps_avx(local_29e0,auVar82._0_32_,6);
              uVar59 = vmovmskps_avx(auVar74);
              root.ptr = uVar54;
            } while ((byte)uVar56 < (byte)POPCOUNT(uVar59));
            *puVar58 = uVar54;
            puVar58 = puVar58 + 1;
            *pauVar53 = auVar82._0_32_;
            pauVar53 = pauVar53 + 1;
          }
          else {
            for (; unaff_R15 != (Geometry *)0x0;
                unaff_R15 = (Geometry *)((ulong)&unaff_R15[-1].field_0x5f & (ulong)unaff_R15)) {
              k = 0;
              for (pGVar55 = unaff_R15; ((ulong)pGVar55 & 1) == 0;
                  pGVar55 = (Geometry *)((ulong)pGVar55 >> 1 | 0x8000000000000000)) {
                k = k + 1;
              }
              local_2ce0._0_8_ = k;
              auVar114 = ZEXT1664(auVar114._0_16_);
              auVar119 = ZEXT1664(auVar119._0_16_);
              auVar124 = ZEXT1664(auVar124._0_16_);
              bVar60 = occluded1(local_2cb8,local_2cc0,root,k,&local_2d39,ray,
                                 (TravRayK<8,_true> *)&local_2b80.field_0,context);
              if (bVar60) {
                *(undefined4 *)(local_2c60 + local_2ce0._0_8_ * 4) = 0xffffffff;
              }
              uVar56 = local_2d30;
              ray = local_2d38;
              context = local_2d28;
            }
            auVar74 = _DAT_01fe9960 & ~local_2c60;
            if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar74 >> 0x7f,0) == '\0') &&
                  (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar74 >> 0xbf,0) == '\0') &&
                (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar74[0x1f]) {
              iVar49 = 3;
            }
            else {
              auVar74._8_4_ = 0xff800000;
              auVar74._0_8_ = 0xff800000ff800000;
              auVar74._12_4_ = 0xff800000;
              auVar74._16_4_ = 0xff800000;
              auVar74._20_4_ = 0xff800000;
              auVar74._24_4_ = 0xff800000;
              auVar74._28_4_ = 0xff800000;
              local_29e0 = vblendvps_avx(local_29e0,auVar74,local_2c60);
              iVar49 = 2;
            }
            auVar133 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar134 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar137 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            auVar82 = ZEXT3264(_local_2d20);
            unaff_R15 = (Geometry *)0x0;
            if ((uint)uVar56 < (uint)POPCOUNT(uVar59)) goto LAB_019cd9aa;
          }
LAB_019cdb31:
        } while ((iVar49 == 4) || (iVar49 == 2));
LAB_019ce532:
        auVar74 = vandps_avx(local_29c0,local_2c60);
        auVar81._8_4_ = 0xff800000;
        auVar81._0_8_ = 0xff800000ff800000;
        auVar81._12_4_ = 0xff800000;
        auVar81._16_4_ = 0xff800000;
        auVar81._20_4_ = 0xff800000;
        auVar81._24_4_ = 0xff800000;
        auVar81._28_4_ = 0xff800000;
        auVar74 = vmaskmovps_avx(auVar74,auVar81);
        *(undefined1 (*) [32])local_2ce8 = auVar74;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    pGVar57 = (Geometry *)((long)&(pGVar57->super_RefCount)._vptr_RefCount + 1);
    lVar51 = lVar51 + 0x50;
    auVar67 = auVar75;
    if (pGVar55 <= pGVar57) break;
LAB_019cdba0:
    local_2ca8 = (long)pGVar57 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_2cb0 = context->scene;
    uVar54 = 0;
    auVar74 = auVar75;
    local_2c00 = auVar75;
    while (*(int *)(lVar51 + uVar54 * 4) != -1) {
      pfVar5 = (local_2cb0->vertices).items[*(uint *)(lVar51 + -0x10 + uVar54 * 4)];
      uVar50 = (ulong)*(uint *)(lVar51 + -0x40 + uVar54 * 4);
      uVar52 = (ulong)*(uint *)(lVar51 + -0x30 + uVar54 * 4);
      fVar2 = pfVar5[uVar50];
      auVar61._4_4_ = fVar2;
      auVar61._0_4_ = fVar2;
      auVar61._8_4_ = fVar2;
      auVar61._12_4_ = fVar2;
      auVar61._16_4_ = fVar2;
      auVar61._20_4_ = fVar2;
      auVar61._24_4_ = fVar2;
      auVar61._28_4_ = fVar2;
      fVar2 = pfVar5[uVar50 + 1];
      auVar76._4_4_ = fVar2;
      auVar76._0_4_ = fVar2;
      auVar76._8_4_ = fVar2;
      auVar76._12_4_ = fVar2;
      auVar76._16_4_ = fVar2;
      auVar76._20_4_ = fVar2;
      auVar76._24_4_ = fVar2;
      auVar76._28_4_ = fVar2;
      fVar2 = pfVar5[uVar50 + 2];
      auVar92._4_4_ = fVar2;
      auVar92._0_4_ = fVar2;
      auVar92._8_4_ = fVar2;
      auVar92._12_4_ = fVar2;
      auVar92._16_4_ = fVar2;
      auVar92._20_4_ = fVar2;
      auVar92._24_4_ = fVar2;
      auVar92._28_4_ = fVar2;
      fVar2 = pfVar5[uVar52];
      auVar98._4_4_ = fVar2;
      auVar98._0_4_ = fVar2;
      auVar98._8_4_ = fVar2;
      auVar98._12_4_ = fVar2;
      auVar98._16_4_ = fVar2;
      auVar98._20_4_ = fVar2;
      auVar98._24_4_ = fVar2;
      auVar98._28_4_ = fVar2;
      fVar2 = pfVar5[uVar52 + 1];
      auVar103._4_4_ = fVar2;
      auVar103._0_4_ = fVar2;
      auVar103._8_4_ = fVar2;
      auVar103._12_4_ = fVar2;
      auVar103._16_4_ = fVar2;
      auVar103._20_4_ = fVar2;
      auVar103._24_4_ = fVar2;
      auVar103._28_4_ = fVar2;
      fVar2 = pfVar5[uVar52 + 2];
      auVar108._4_4_ = fVar2;
      auVar108._0_4_ = fVar2;
      auVar108._8_4_ = fVar2;
      auVar108._12_4_ = fVar2;
      auVar108._16_4_ = fVar2;
      auVar108._20_4_ = fVar2;
      auVar108._24_4_ = fVar2;
      auVar108._28_4_ = fVar2;
      uVar50 = (ulong)*(uint *)(lVar51 + -0x20 + uVar54 * 4);
      fVar2 = pfVar5[uVar50];
      auVar111._4_4_ = fVar2;
      auVar111._0_4_ = fVar2;
      auVar111._8_4_ = fVar2;
      auVar111._12_4_ = fVar2;
      auVar111._16_4_ = fVar2;
      auVar111._20_4_ = fVar2;
      auVar111._24_4_ = fVar2;
      auVar111._28_4_ = fVar2;
      fVar2 = pfVar5[uVar50 + 1];
      auVar136._4_4_ = fVar2;
      auVar136._0_4_ = fVar2;
      auVar136._8_4_ = fVar2;
      auVar136._12_4_ = fVar2;
      auVar136._16_4_ = fVar2;
      auVar136._20_4_ = fVar2;
      auVar136._24_4_ = fVar2;
      auVar136._28_4_ = fVar2;
      fVar2 = pfVar5[uVar50 + 2];
      auVar116._4_4_ = fVar2;
      auVar116._0_4_ = fVar2;
      auVar116._8_4_ = fVar2;
      auVar116._12_4_ = fVar2;
      auVar116._16_4_ = fVar2;
      auVar116._20_4_ = fVar2;
      auVar116._24_4_ = fVar2;
      auVar116._28_4_ = fVar2;
      local_2b90 = *(undefined8 *)(local_2ca8 + 0x30);
      uStack_2b88 = *(undefined8 *)(local_2ca8 + 0x38);
      local_2ba0 = *(undefined8 *)(local_2ca8 + 0x40);
      uStack_2b98 = *(undefined8 *)(local_2ca8 + 0x48);
      auVar67 = *(undefined1 (*) [32])ray;
      auVar79 = *(undefined1 (*) [32])(ray + 0x20);
      auVar102 = *(undefined1 (*) [32])(ray + 0x40);
      local_2be0 = vsubps_avx(auVar61,auVar67);
      local_2760 = vsubps_avx(auVar76,auVar79);
      local_2780 = vsubps_avx(auVar92,auVar102);
      auVar106 = vsubps_avx(auVar98,auVar67);
      auVar107 = vsubps_avx(auVar103,auVar79);
      auVar80 = vsubps_avx(auVar108,auVar102);
      auVar121 = vsubps_avx(auVar111,auVar67);
      auVar101 = vsubps_avx(auVar136,auVar79);
      auVar102 = vsubps_avx(auVar116,auVar102);
      local_27a0 = vsubps_avx(auVar121,local_2be0);
      local_27e0 = vsubps_avx(auVar101,local_2760);
      local_27c0 = vsubps_avx(auVar102,local_2780);
      auVar99._0_4_ = auVar121._0_4_ + local_2be0._0_4_;
      auVar99._4_4_ = auVar121._4_4_ + local_2be0._4_4_;
      auVar99._8_4_ = auVar121._8_4_ + local_2be0._8_4_;
      auVar99._12_4_ = auVar121._12_4_ + local_2be0._12_4_;
      auVar99._16_4_ = auVar121._16_4_ + local_2be0._16_4_;
      auVar99._20_4_ = auVar121._20_4_ + local_2be0._20_4_;
      auVar99._24_4_ = auVar121._24_4_ + local_2be0._24_4_;
      auVar99._28_4_ = auVar121._28_4_ + local_2be0._28_4_;
      auVar112._0_4_ = local_2760._0_4_ + auVar101._0_4_;
      auVar112._4_4_ = local_2760._4_4_ + auVar101._4_4_;
      auVar112._8_4_ = local_2760._8_4_ + auVar101._8_4_;
      auVar112._12_4_ = local_2760._12_4_ + auVar101._12_4_;
      auVar112._16_4_ = local_2760._16_4_ + auVar101._16_4_;
      auVar112._20_4_ = local_2760._20_4_ + auVar101._20_4_;
      auVar112._24_4_ = local_2760._24_4_ + auVar101._24_4_;
      auVar112._28_4_ = local_2760._28_4_ + auVar101._28_4_;
      fVar2 = local_2780._0_4_;
      auVar117._0_4_ = auVar102._0_4_ + fVar2;
      fVar7 = local_2780._4_4_;
      auVar117._4_4_ = auVar102._4_4_ + fVar7;
      fVar8 = local_2780._8_4_;
      auVar117._8_4_ = auVar102._8_4_ + fVar8;
      fVar9 = local_2780._12_4_;
      auVar117._12_4_ = auVar102._12_4_ + fVar9;
      fVar10 = local_2780._16_4_;
      auVar117._16_4_ = auVar102._16_4_ + fVar10;
      fVar11 = local_2780._20_4_;
      auVar117._20_4_ = auVar102._20_4_ + fVar11;
      fVar12 = local_2780._24_4_;
      auVar117._24_4_ = auVar102._24_4_ + fVar12;
      fVar97 = auVar102._28_4_;
      auVar117._28_4_ = fVar97 + local_2780._28_4_;
      auVar17._4_4_ = local_27c0._4_4_ * auVar112._4_4_;
      auVar17._0_4_ = local_27c0._0_4_ * auVar112._0_4_;
      auVar17._8_4_ = local_27c0._8_4_ * auVar112._8_4_;
      auVar17._12_4_ = local_27c0._12_4_ * auVar112._12_4_;
      auVar17._16_4_ = local_27c0._16_4_ * auVar112._16_4_;
      auVar17._20_4_ = local_27c0._20_4_ * auVar112._20_4_;
      auVar17._24_4_ = local_27c0._24_4_ * auVar112._24_4_;
      auVar17._28_4_ = auVar79._28_4_;
      auVar16 = vfmsub231ps_fma(auVar17,local_27e0,auVar117);
      auVar109._4_4_ = auVar117._4_4_ * local_27a0._4_4_;
      auVar109._0_4_ = auVar117._0_4_ * local_27a0._0_4_;
      auVar109._8_4_ = auVar117._8_4_ * local_27a0._8_4_;
      auVar109._12_4_ = auVar117._12_4_ * local_27a0._12_4_;
      auVar109._16_4_ = auVar117._16_4_ * local_27a0._16_4_;
      auVar109._20_4_ = auVar117._20_4_ * local_27a0._20_4_;
      auVar109._24_4_ = auVar117._24_4_ * local_27a0._24_4_;
      auVar109._28_4_ = auVar67._28_4_;
      auVar66 = vfmsub231ps_fma(auVar109,local_27c0,auVar99);
      auVar26._4_4_ = local_27e0._4_4_ * auVar99._4_4_;
      auVar26._0_4_ = local_27e0._0_4_ * auVar99._0_4_;
      auVar26._8_4_ = local_27e0._8_4_ * auVar99._8_4_;
      auVar26._12_4_ = local_27e0._12_4_ * auVar99._12_4_;
      auVar26._16_4_ = local_27e0._16_4_ * auVar99._16_4_;
      auVar26._20_4_ = local_27e0._20_4_ * auVar99._20_4_;
      auVar26._24_4_ = local_27e0._24_4_ * auVar99._24_4_;
      auVar26._28_4_ = auVar99._28_4_;
      auVar18 = vfmsub231ps_fma(auVar26,local_27a0,auVar112);
      pRVar1 = ray + 0xc0;
      fVar64 = *(float *)pRVar1;
      fVar83 = *(float *)(ray + 0xc4);
      fVar85 = *(float *)(ray + 200);
      fVar87 = *(float *)(ray + 0xcc);
      fVar89 = *(float *)(ray + 0xd0);
      fVar90 = *(float *)(ray + 0xd4);
      fVar91 = *(float *)(ray + 0xd8);
      auVar48 = *(undefined1 (*) [28])pRVar1;
      auVar100._0_4_ = fVar64 * auVar18._0_4_;
      auVar100._4_4_ = fVar83 * auVar18._4_4_;
      auVar100._8_4_ = fVar85 * auVar18._8_4_;
      auVar100._12_4_ = fVar87 * auVar18._12_4_;
      auVar100._16_4_ = fVar89 * 0.0;
      auVar100._20_4_ = fVar90 * 0.0;
      auVar100._24_4_ = fVar91 * 0.0;
      auVar100._28_4_ = 0;
      local_2ca0 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar66 = vfmadd231ps_fma(auVar100,local_2ca0,ZEXT1632(auVar66));
      local_2c80 = *(undefined1 (*) [32])(ray + 0x80);
      auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),local_2c80,ZEXT1632(auVar16));
      local_2800 = vsubps_avx(local_2760,auVar107);
      auVar78 = vsubps_avx(local_2780,auVar80);
      auVar113._0_4_ = local_2760._0_4_ + auVar107._0_4_;
      auVar113._4_4_ = local_2760._4_4_ + auVar107._4_4_;
      auVar113._8_4_ = local_2760._8_4_ + auVar107._8_4_;
      auVar113._12_4_ = local_2760._12_4_ + auVar107._12_4_;
      auVar113._16_4_ = local_2760._16_4_ + auVar107._16_4_;
      auVar113._20_4_ = local_2760._20_4_ + auVar107._20_4_;
      auVar113._24_4_ = local_2760._24_4_ + auVar107._24_4_;
      auVar113._28_4_ = local_2760._28_4_ + auVar107._28_4_;
      auVar144._0_4_ = fVar2 + auVar80._0_4_;
      auVar144._4_4_ = fVar7 + auVar80._4_4_;
      auVar144._8_4_ = fVar8 + auVar80._8_4_;
      auVar144._12_4_ = fVar9 + auVar80._12_4_;
      auVar144._16_4_ = fVar10 + auVar80._16_4_;
      auVar144._20_4_ = fVar11 + auVar80._20_4_;
      auVar144._24_4_ = fVar12 + auVar80._24_4_;
      auVar144._28_4_ = local_2780._28_4_ + auVar80._28_4_;
      fVar135 = auVar78._0_4_;
      fVar138 = auVar78._4_4_;
      auVar27._4_4_ = fVar138 * auVar113._4_4_;
      auVar27._0_4_ = fVar135 * auVar113._0_4_;
      fVar139 = auVar78._8_4_;
      auVar27._8_4_ = fVar139 * auVar113._8_4_;
      fVar140 = auVar78._12_4_;
      auVar27._12_4_ = fVar140 * auVar113._12_4_;
      fVar141 = auVar78._16_4_;
      auVar27._16_4_ = fVar141 * auVar113._16_4_;
      fVar142 = auVar78._20_4_;
      auVar27._20_4_ = fVar142 * auVar113._20_4_;
      fVar143 = auVar78._24_4_;
      auVar27._24_4_ = fVar143 * auVar113._24_4_;
      auVar27._28_4_ = local_27a0._28_4_;
      auVar18 = vfmsub231ps_fma(auVar27,local_2800,auVar144);
      auVar75 = vsubps_avx(local_2be0,auVar106);
      fVar65 = auVar75._0_4_;
      fVar84 = auVar75._4_4_;
      auVar28._4_4_ = auVar144._4_4_ * fVar84;
      auVar28._0_4_ = auVar144._0_4_ * fVar65;
      fVar86 = auVar75._8_4_;
      auVar28._8_4_ = auVar144._8_4_ * fVar86;
      fVar88 = auVar75._12_4_;
      auVar28._12_4_ = auVar144._12_4_ * fVar88;
      fVar13 = auVar75._16_4_;
      auVar28._16_4_ = auVar144._16_4_ * fVar13;
      fVar14 = auVar75._20_4_;
      auVar28._20_4_ = auVar144._20_4_ * fVar14;
      fVar15 = auVar75._24_4_;
      auVar28._24_4_ = auVar144._24_4_ * fVar15;
      auVar28._28_4_ = auVar144._28_4_;
      auVar115._0_4_ = auVar106._0_4_ + local_2be0._0_4_;
      auVar115._4_4_ = auVar106._4_4_ + local_2be0._4_4_;
      auVar115._8_4_ = auVar106._8_4_ + local_2be0._8_4_;
      auVar115._12_4_ = auVar106._12_4_ + local_2be0._12_4_;
      auVar115._16_4_ = auVar106._16_4_ + local_2be0._16_4_;
      auVar115._20_4_ = auVar106._20_4_ + local_2be0._20_4_;
      auVar115._24_4_ = auVar106._24_4_ + local_2be0._24_4_;
      auVar115._28_4_ = auVar106._28_4_ + local_2be0._28_4_;
      auVar16 = vfmsub231ps_fma(auVar28,auVar78,auVar115);
      fVar126 = local_2800._0_4_;
      fVar127 = local_2800._4_4_;
      auVar29._4_4_ = fVar127 * auVar115._4_4_;
      auVar29._0_4_ = fVar126 * auVar115._0_4_;
      fVar128 = local_2800._8_4_;
      auVar29._8_4_ = fVar128 * auVar115._8_4_;
      fVar129 = local_2800._12_4_;
      auVar29._12_4_ = fVar129 * auVar115._12_4_;
      fVar130 = local_2800._16_4_;
      auVar29._16_4_ = fVar130 * auVar115._16_4_;
      fVar131 = local_2800._20_4_;
      auVar29._20_4_ = fVar131 * auVar115._20_4_;
      fVar132 = local_2800._24_4_;
      auVar29._24_4_ = fVar132 * auVar115._24_4_;
      auVar29._28_4_ = auVar115._28_4_;
      auVar19 = vfmsub231ps_fma(auVar29,auVar75,auVar113);
      auVar30._4_4_ = fVar83 * auVar19._4_4_;
      auVar30._0_4_ = fVar64 * auVar19._0_4_;
      auVar30._8_4_ = fVar85 * auVar19._8_4_;
      auVar30._12_4_ = fVar87 * auVar19._12_4_;
      auVar30._16_4_ = fVar89 * 0.0;
      auVar30._20_4_ = fVar90 * 0.0;
      auVar30._24_4_ = fVar91 * 0.0;
      auVar30._28_4_ = auVar113._28_4_;
      auVar16 = vfmadd231ps_fma(auVar30,local_2ca0,ZEXT1632(auVar16));
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_2c80,ZEXT1632(auVar18));
      auVar114 = ZEXT1664(auVar16);
      auVar17 = vsubps_avx(auVar106,auVar121);
      auVar77._0_4_ = auVar106._0_4_ + auVar121._0_4_;
      auVar77._4_4_ = auVar106._4_4_ + auVar121._4_4_;
      auVar77._8_4_ = auVar106._8_4_ + auVar121._8_4_;
      auVar77._12_4_ = auVar106._12_4_ + auVar121._12_4_;
      auVar77._16_4_ = auVar106._16_4_ + auVar121._16_4_;
      auVar77._20_4_ = auVar106._20_4_ + auVar121._20_4_;
      auVar77._24_4_ = auVar106._24_4_ + auVar121._24_4_;
      auVar77._28_4_ = auVar106._28_4_ + auVar121._28_4_;
      auVar121 = vsubps_avx(auVar107,auVar101);
      auVar62._0_4_ = auVar107._0_4_ + auVar101._0_4_;
      auVar62._4_4_ = auVar107._4_4_ + auVar101._4_4_;
      auVar62._8_4_ = auVar107._8_4_ + auVar101._8_4_;
      auVar62._12_4_ = auVar107._12_4_ + auVar101._12_4_;
      auVar62._16_4_ = auVar107._16_4_ + auVar101._16_4_;
      auVar62._20_4_ = auVar107._20_4_ + auVar101._20_4_;
      auVar62._24_4_ = auVar107._24_4_ + auVar101._24_4_;
      auVar62._28_4_ = auVar107._28_4_ + auVar101._28_4_;
      auVar107 = vsubps_avx(auVar80,auVar102);
      auVar93._0_4_ = auVar80._0_4_ + auVar102._0_4_;
      auVar93._4_4_ = auVar80._4_4_ + auVar102._4_4_;
      auVar93._8_4_ = auVar80._8_4_ + auVar102._8_4_;
      auVar93._12_4_ = auVar80._12_4_ + auVar102._12_4_;
      auVar93._16_4_ = auVar80._16_4_ + auVar102._16_4_;
      auVar93._20_4_ = auVar80._20_4_ + auVar102._20_4_;
      auVar93._24_4_ = auVar80._24_4_ + auVar102._24_4_;
      auVar93._28_4_ = auVar80._28_4_ + fVar97;
      auVar31._4_4_ = auVar107._4_4_ * auVar62._4_4_;
      auVar31._0_4_ = auVar107._0_4_ * auVar62._0_4_;
      auVar31._8_4_ = auVar107._8_4_ * auVar62._8_4_;
      auVar31._12_4_ = auVar107._12_4_ * auVar62._12_4_;
      auVar31._16_4_ = auVar107._16_4_ * auVar62._16_4_;
      auVar31._20_4_ = auVar107._20_4_ * auVar62._20_4_;
      auVar31._24_4_ = auVar107._24_4_ * auVar62._24_4_;
      auVar31._28_4_ = fVar97;
      auVar19 = vfmsub231ps_fma(auVar31,auVar121,auVar93);
      auVar32._4_4_ = auVar17._4_4_ * auVar93._4_4_;
      auVar32._0_4_ = auVar17._0_4_ * auVar93._0_4_;
      auVar32._8_4_ = auVar17._8_4_ * auVar93._8_4_;
      auVar32._12_4_ = auVar17._12_4_ * auVar93._12_4_;
      auVar32._16_4_ = auVar17._16_4_ * auVar93._16_4_;
      auVar32._20_4_ = auVar17._20_4_ * auVar93._20_4_;
      auVar32._24_4_ = auVar17._24_4_ * auVar93._24_4_;
      auVar32._28_4_ = auVar93._28_4_;
      auVar18 = vfmsub231ps_fma(auVar32,auVar107,auVar77);
      auVar33._4_4_ = auVar121._4_4_ * auVar77._4_4_;
      auVar33._0_4_ = auVar121._0_4_ * auVar77._0_4_;
      auVar33._8_4_ = auVar121._8_4_ * auVar77._8_4_;
      auVar33._12_4_ = auVar121._12_4_ * auVar77._12_4_;
      auVar33._16_4_ = auVar121._16_4_ * auVar77._16_4_;
      auVar33._20_4_ = auVar121._20_4_ * auVar77._20_4_;
      auVar33._24_4_ = auVar121._24_4_ * auVar77._24_4_;
      auVar33._28_4_ = auVar77._28_4_;
      auVar20 = vfmsub231ps_fma(auVar33,auVar17,auVar62);
      auVar34._4_4_ = fVar83 * auVar20._4_4_;
      auVar34._0_4_ = fVar64 * auVar20._0_4_;
      auVar34._8_4_ = fVar85 * auVar20._8_4_;
      auVar34._12_4_ = fVar87 * auVar20._12_4_;
      auVar34._16_4_ = fVar89 * 0.0;
      auVar34._20_4_ = fVar90 * 0.0;
      auVar34._24_4_ = fVar91 * 0.0;
      auVar34._28_4_ = auVar62._28_4_;
      auVar18 = vfmadd231ps_fma(auVar34,local_2ca0,ZEXT1632(auVar18));
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),local_2c80,ZEXT1632(auVar19));
      auVar109 = ZEXT1632(CONCAT412(auVar18._12_4_ + auVar66._12_4_ + auVar16._12_4_,
                                    CONCAT48(auVar18._8_4_ + auVar66._8_4_ + auVar16._8_4_,
                                             CONCAT44(auVar18._4_4_ + auVar66._4_4_ + auVar16._4_4_,
                                                      auVar18._0_4_ + auVar66._0_4_ + auVar16._0_4_)
                                            )));
      auVar67 = vandps_avx(local_28a0,auVar109);
      fVar64 = auVar67._0_4_ * 1.1920929e-07;
      fVar83 = auVar67._4_4_ * 1.1920929e-07;
      auVar35._4_4_ = fVar83;
      auVar35._0_4_ = fVar64;
      fVar85 = auVar67._8_4_ * 1.1920929e-07;
      auVar35._8_4_ = fVar85;
      fVar87 = auVar67._12_4_ * 1.1920929e-07;
      auVar35._12_4_ = fVar87;
      fVar89 = auVar67._16_4_ * 1.1920929e-07;
      auVar35._16_4_ = fVar89;
      fVar90 = auVar67._20_4_ * 1.1920929e-07;
      auVar35._20_4_ = fVar90;
      fVar91 = auVar67._24_4_ * 1.1920929e-07;
      auVar35._24_4_ = fVar91;
      auVar35._28_4_ = auVar67._28_4_;
      auVar101 = ZEXT1632(auVar66);
      auVar79 = vminps_avx(auVar101,ZEXT1632(auVar16));
      auVar79 = vminps_avx(auVar79,ZEXT1632(auVar18));
      auVar123._8_4_ = 0x80000000;
      auVar123._0_8_ = 0x8000000080000000;
      auVar123._12_4_ = 0x80000000;
      auVar123._16_4_ = 0x80000000;
      auVar123._20_4_ = 0x80000000;
      auVar123._24_4_ = 0x80000000;
      auVar123._28_4_ = 0x80000000;
      auVar104._0_8_ = CONCAT44(fVar83,fVar64) ^ 0x8000000080000000;
      auVar104._8_4_ = -fVar85;
      auVar104._12_4_ = -fVar87;
      auVar104._16_4_ = -fVar89;
      auVar104._20_4_ = -fVar90;
      auVar104._24_4_ = -fVar91;
      auVar104._28_4_ = auVar67._28_4_ ^ 0x80000000;
      auVar79 = vcmpps_avx(auVar79,auVar104,5);
      auVar102 = vmaxps_avx(auVar101,ZEXT1632(auVar16));
      auVar67 = vmaxps_avx(auVar102,ZEXT1632(auVar18));
      auVar67 = vcmpps_avx(auVar67,auVar35,2);
      auVar106 = vorps_avx(auVar79,auVar67);
      auVar80 = auVar74 & auVar106;
      auVar67 = vandps_avx(auVar106,auVar74);
      auVar118 = local_2ca0;
      if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar80 >> 0x7f,0) != '\0') ||
            (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar80 >> 0xbf,0) != '\0') ||
          (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar80[0x1f] < '\0') {
        local_2880 = auVar109;
        local_2820 = auVar67;
        local_2840 = auVar123;
        auVar36._4_4_ = fVar127 * local_27c0._4_4_;
        auVar36._0_4_ = fVar126 * local_27c0._0_4_;
        auVar36._8_4_ = fVar128 * local_27c0._8_4_;
        auVar36._12_4_ = fVar129 * local_27c0._12_4_;
        auVar36._16_4_ = fVar130 * local_27c0._16_4_;
        auVar36._20_4_ = fVar131 * local_27c0._20_4_;
        auVar36._24_4_ = fVar132 * local_27c0._24_4_;
        auVar36._28_4_ = auVar106._28_4_;
        local_2860 = fVar65 * local_27e0._0_4_;
        fStack_285c = fVar84 * local_27e0._4_4_;
        fStack_2858 = fVar86 * local_27e0._8_4_;
        fStack_2854 = fVar88 * local_27e0._12_4_;
        fStack_2850 = fVar13 * local_27e0._16_4_;
        fStack_284c = fVar14 * local_27e0._20_4_;
        uStack_2844 = auVar79._28_4_;
        fStack_2848 = fVar15 * local_27e0._24_4_;
        auVar66 = vfmsub213ps_fma(local_27e0,auVar78,auVar36);
        auVar37._4_4_ = auVar121._4_4_ * fVar138;
        auVar37._0_4_ = auVar121._0_4_ * fVar135;
        auVar37._8_4_ = auVar121._8_4_ * fVar139;
        auVar37._12_4_ = auVar121._12_4_ * fVar140;
        auVar37._16_4_ = auVar121._16_4_ * fVar141;
        auVar37._20_4_ = auVar121._20_4_ * fVar142;
        auVar37._24_4_ = auVar121._24_4_ * fVar143;
        auVar37._28_4_ = uStack_2844;
        auVar38._4_4_ = fVar84 * auVar107._4_4_;
        auVar38._0_4_ = fVar65 * auVar107._0_4_;
        auVar38._8_4_ = fVar86 * auVar107._8_4_;
        auVar38._12_4_ = fVar88 * auVar107._12_4_;
        auVar38._16_4_ = fVar13 * auVar107._16_4_;
        auVar38._20_4_ = fVar14 * auVar107._20_4_;
        auVar38._24_4_ = fVar15 * auVar107._24_4_;
        auVar38._28_4_ = auVar102._28_4_;
        auVar18 = vfmsub213ps_fma(auVar107,local_2800,auVar37);
        auVar79 = vandps_avx(local_28a0,auVar36);
        auVar102 = vandps_avx(local_28a0,auVar37);
        auVar79 = vcmpps_avx(auVar79,auVar102,1);
        auVar106 = vblendvps_avx(ZEXT1632(auVar18),ZEXT1632(auVar66),auVar79);
        auVar110._0_4_ = auVar17._0_4_ * fVar126;
        auVar110._4_4_ = auVar17._4_4_ * fVar127;
        auVar110._8_4_ = auVar17._8_4_ * fVar128;
        auVar110._12_4_ = auVar17._12_4_ * fVar129;
        auVar110._16_4_ = auVar17._16_4_ * fVar130;
        auVar110._20_4_ = auVar17._20_4_ * fVar131;
        auVar110._24_4_ = auVar17._24_4_ * fVar132;
        auVar110._28_4_ = 0;
        auVar66 = vfmsub213ps_fma(auVar17,auVar78,auVar38);
        auVar39._4_4_ = fVar138 * local_27a0._4_4_;
        auVar39._0_4_ = fVar135 * local_27a0._0_4_;
        auVar39._8_4_ = fVar139 * local_27a0._8_4_;
        auVar39._12_4_ = fVar140 * local_27a0._12_4_;
        auVar39._16_4_ = fVar141 * local_27a0._16_4_;
        auVar39._20_4_ = fVar142 * local_27a0._20_4_;
        auVar39._24_4_ = fVar143 * local_27a0._24_4_;
        auVar39._28_4_ = auVar102._28_4_;
        auVar18 = vfmsub213ps_fma(local_27c0,auVar75,auVar39);
        auVar79 = vandps_avx(local_28a0,auVar39);
        auVar102 = vandps_avx(local_28a0,auVar38);
        auVar79 = vcmpps_avx(auVar79,auVar102,1);
        auVar107 = vblendvps_avx(ZEXT1632(auVar66),ZEXT1632(auVar18),auVar79);
        auVar47._4_4_ = fStack_285c;
        auVar47._0_4_ = local_2860;
        auVar47._8_4_ = fStack_2858;
        auVar47._12_4_ = fStack_2854;
        auVar47._16_4_ = fStack_2850;
        auVar47._20_4_ = fStack_284c;
        auVar47._24_4_ = fStack_2848;
        auVar47._28_4_ = uStack_2844;
        auVar66 = vfmsub213ps_fma(local_27a0,local_2800,auVar47);
        auVar18 = vfmsub213ps_fma(auVar121,auVar75,auVar110);
        auVar79 = vandps_avx(local_28a0,auVar47);
        auVar102 = vandps_avx(local_28a0,auVar110);
        auVar79 = vcmpps_avx(auVar79,auVar102,1);
        auVar102 = vblendvps_avx(ZEXT1632(auVar18),ZEXT1632(auVar66),auVar79);
        local_2d20._0_4_ = auVar48._0_4_;
        local_2d20._4_4_ = auVar48._4_4_;
        auStack_2d18._0_4_ = auVar48._8_4_;
        auStack_2d18._4_4_ = auVar48._12_4_;
        fStack_2d10 = auVar48._16_4_;
        fStack_2d0c = auVar48._20_4_;
        fStack_2d08 = auVar48._24_4_;
        auVar40._4_4_ = auVar102._4_4_ * (float)local_2d20._4_4_;
        auVar40._0_4_ = auVar102._0_4_ * (float)local_2d20._0_4_;
        auVar40._8_4_ = auVar102._8_4_ * (float)auStack_2d18._0_4_;
        auVar40._12_4_ = auVar102._12_4_ * (float)auStack_2d18._4_4_;
        auVar40._16_4_ = auVar102._16_4_ * fStack_2d10;
        auVar40._20_4_ = auVar102._20_4_ * fStack_2d0c;
        auVar40._24_4_ = auVar102._24_4_ * fStack_2d08;
        auVar40._28_4_ = auVar79._28_4_;
        auVar66 = vfmadd213ps_fma(local_2ca0,auVar107,auVar40);
        auVar66 = vfmadd213ps_fma(local_2c80,auVar106,ZEXT1632(auVar66));
        fVar65 = auVar66._0_4_ + auVar66._0_4_;
        fVar84 = auVar66._4_4_ + auVar66._4_4_;
        fVar86 = auVar66._8_4_ + auVar66._8_4_;
        fVar88 = auVar66._12_4_ + auVar66._12_4_;
        auVar78 = ZEXT1632(CONCAT412(fVar88,CONCAT48(fVar86,CONCAT44(fVar84,fVar65))));
        auVar41._4_4_ = auVar102._4_4_ * fVar7;
        auVar41._0_4_ = auVar102._0_4_ * fVar2;
        auVar41._8_4_ = auVar102._8_4_ * fVar8;
        auVar41._12_4_ = auVar102._12_4_ * fVar9;
        auVar41._16_4_ = auVar102._16_4_ * fVar10;
        auVar41._20_4_ = auVar102._20_4_ * fVar11;
        auVar41._24_4_ = auVar102._24_4_ * fVar12;
        auVar41._28_4_ = 0;
        auVar66 = vfmadd213ps_fma(local_2760,auVar107,auVar41);
        auVar18 = vfmadd213ps_fma(local_2be0,auVar106,ZEXT1632(auVar66));
        auVar79 = vrcpps_avx(auVar78);
        auVar122._8_4_ = 0x3f800000;
        auVar122._0_8_ = 0x3f8000003f800000;
        auVar122._12_4_ = 0x3f800000;
        auVar122._16_4_ = 0x3f800000;
        auVar122._20_4_ = 0x3f800000;
        auVar122._24_4_ = 0x3f800000;
        auVar122._28_4_ = 0x3f800000;
        auVar66 = vfnmadd213ps_fma(auVar79,auVar78,auVar122);
        auVar66 = vfmadd132ps_fma(ZEXT1632(auVar66),auVar79,auVar79);
        auVar121 = ZEXT1632(CONCAT412(auVar66._12_4_ * (auVar18._12_4_ + auVar18._12_4_),
                                      CONCAT48(auVar66._8_4_ * (auVar18._8_4_ + auVar18._8_4_),
                                               CONCAT44(auVar66._4_4_ *
                                                        (auVar18._4_4_ + auVar18._4_4_),
                                                        auVar66._0_4_ *
                                                        (auVar18._0_4_ + auVar18._0_4_)))));
        auVar79 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar121,2);
        auVar80 = vcmpps_avx(auVar121,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar79 = vandps_avx(auVar80,auVar79);
        auVar118._0_8_ = CONCAT44(fVar84,fVar65) ^ 0x8000000080000000;
        auVar118._8_4_ = -fVar86;
        auVar118._12_4_ = -fVar88;
        auVar118._16_4_ = 0x80000000;
        auVar118._20_4_ = 0x80000000;
        auVar118._24_4_ = 0x80000000;
        auVar118._28_4_ = 0x80000000;
        auVar80 = vcmpps_avx(auVar118,auVar78,4);
        auVar79 = vandps_avx(auVar80,auVar79);
        auVar79 = vpslld_avx2(auVar79,0x1f);
        auVar80 = vpsrad_avx2(auVar79,0x1f);
        auVar79 = auVar67 & auVar80;
        auVar67 = vandps_avx(auVar80,auVar67);
        auVar123 = local_2800;
        if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar79 >> 0x7f,0) != '\0') ||
              (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar79 >> 0xbf,0) != '\0') ||
            (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar79[0x1f] < '\0') {
          _local_28c0 = auVar101;
          _local_28e0 = ZEXT1632(auVar16);
          local_2900 = auVar109;
          local_2920 = auVar121;
          local_2940 = auVar106;
          local_2960 = auVar107;
          local_2980 = auVar102;
        }
      }
      auVar137 = ZEXT3264(CONCAT428(0x3f800003,
                                    CONCAT424(0x3f800003,
                                              CONCAT420(0x3f800003,
                                                        CONCAT416(0x3f800003,
                                                                  CONCAT412(0x3f800003,
                                                                            CONCAT48(0x3f800003,
                                                                                                                                                                          
                                                  0x3f8000033f800003)))))));
      auVar134 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                    CONCAT424(0x3f7ffffa,
                                              CONCAT420(0x3f7ffffa,
                                                        CONCAT416(0x3f7ffffa,
                                                                  CONCAT412(0x3f7ffffa,
                                                                            CONCAT48(0x3f7ffffa,
                                                                                                                                                                          
                                                  0x3f7ffffa3f7ffffa)))))));
      auVar133 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar124 = ZEXT3264(auVar123);
      auVar119 = ZEXT3264(auVar118);
      uVar4 = *(uint *)((long)&local_2b90 + uVar54 * 4);
      unaff_R15 = (context->scene->geometries).items[uVar4].ptr;
      uVar3 = unaff_R15->mask;
      auVar63._4_4_ = uVar3;
      auVar63._0_4_ = uVar3;
      auVar63._8_4_ = uVar3;
      auVar63._12_4_ = uVar3;
      auVar63._16_4_ = uVar3;
      auVar63._20_4_ = uVar3;
      auVar63._24_4_ = uVar3;
      auVar63._28_4_ = uVar3;
      auVar79 = vpand_avx2(auVar63,*(undefined1 (*) [32])(ray + 0x120));
      auVar102 = vpcmpeqd_avx2(auVar79,_DAT_01faff00);
      auVar79 = auVar67 & ~auVar102;
      local_2ce0 = auVar74;
      if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar79 >> 0x7f,0) != '\0') ||
            (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar79 >> 0xbf,0) != '\0') ||
          (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar79[0x1f] < '\0') {
        uVar59 = *(undefined4 *)((long)&local_2ba0 + uVar54 * 4);
        auVar74 = vandnps_avx(auVar102,auVar67);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (local_2d20 = (undefined1  [8])lVar51,
           unaff_R15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          _auStack_2d18 = SUB3224(*(undefined1 (*) [32])pRVar1,8);
          local_2d20 = (undefined1  [8])lVar51;
          auVar67 = vandps_avx(local_28a0,local_2900);
          auVar79 = vrcpps_avx(local_2900);
          auVar105._8_4_ = 0x3f800000;
          auVar105._0_8_ = 0x3f8000003f800000;
          auVar105._12_4_ = 0x3f800000;
          auVar105._16_4_ = 0x3f800000;
          auVar105._20_4_ = 0x3f800000;
          auVar105._24_4_ = 0x3f800000;
          auVar105._28_4_ = 0x3f800000;
          auVar66 = vfnmadd213ps_fma(auVar79,local_2900,auVar105);
          auVar66 = vfmadd132ps_fma(ZEXT1632(auVar66),auVar79,auVar79);
          auVar94._8_4_ = 0x219392ef;
          auVar94._0_8_ = 0x219392ef219392ef;
          auVar94._12_4_ = 0x219392ef;
          auVar94._16_4_ = 0x219392ef;
          auVar94._20_4_ = 0x219392ef;
          auVar94._24_4_ = 0x219392ef;
          auVar94._28_4_ = 0x219392ef;
          auVar67 = vcmpps_avx(auVar67,auVar94,5);
          auVar67 = vandps_avx(auVar67,ZEXT1632(auVar66));
          auVar42._4_4_ = auVar67._4_4_ * (float)local_28c0._4_4_;
          auVar42._0_4_ = auVar67._0_4_ * (float)local_28c0._0_4_;
          auVar42._8_4_ = auVar67._8_4_ * fStack_28b8;
          auVar42._12_4_ = auVar67._12_4_ * fStack_28b4;
          auVar42._16_4_ = auVar67._16_4_ * fStack_28b0;
          auVar42._20_4_ = auVar67._20_4_ * fStack_28ac;
          auVar42._24_4_ = auVar67._24_4_ * fStack_28a8;
          auVar42._28_4_ = 0x219392ef;
          local_26e0 = vminps_avx(auVar42,auVar105);
          auVar43._4_4_ = auVar67._4_4_ * (float)local_28e0._4_4_;
          auVar43._0_4_ = auVar67._0_4_ * (float)local_28e0._0_4_;
          auVar43._8_4_ = auVar67._8_4_ * fStack_28d8;
          auVar43._12_4_ = auVar67._12_4_ * fStack_28d4;
          auVar43._16_4_ = auVar67._16_4_ * fStack_28d0;
          auVar43._20_4_ = auVar67._20_4_ * fStack_28cc;
          auVar43._24_4_ = auVar67._24_4_ * fStack_28c8;
          auVar43._28_4_ = auVar67._28_4_;
          local_26c0 = vminps_avx(auVar43,auVar105);
          local_2680._4_4_ = uVar4;
          local_2680._0_4_ = uVar4;
          local_2680._8_4_ = uVar4;
          local_2680._12_4_ = uVar4;
          local_2680._16_4_ = uVar4;
          local_2680._20_4_ = uVar4;
          local_2680._24_4_ = uVar4;
          local_2680._28_4_ = uVar4;
          local_26a0._4_4_ = uVar59;
          local_26a0._0_4_ = uVar59;
          local_26a0._8_4_ = uVar59;
          local_26a0._12_4_ = uVar59;
          local_26a0._16_4_ = uVar59;
          local_26a0._20_4_ = uVar59;
          local_26a0._24_4_ = uVar59;
          local_26a0._28_4_ = uVar59;
          local_2740 = local_2940._0_8_;
          uStack_2738 = local_2940._8_8_;
          uStack_2730 = local_2940._16_8_;
          uStack_2728 = local_2940._24_8_;
          local_2720 = local_2960._0_8_;
          uStack_2718 = local_2960._8_8_;
          uStack_2710 = local_2960._16_8_;
          uStack_2708 = local_2960._24_8_;
          local_2700 = local_2980;
          auVar79 = vpcmpeqd_avx2(local_26e0,local_26e0);
          local_2660._4_4_ = context->user->instID[0];
          local_2660._0_4_ = local_2660._4_4_;
          local_2660._8_4_ = local_2660._4_4_;
          local_2660._12_4_ = local_2660._4_4_;
          local_2660._16_4_ = local_2660._4_4_;
          local_2660._20_4_ = local_2660._4_4_;
          local_2660._24_4_ = local_2660._4_4_;
          local_2660._28_4_ = local_2660._4_4_;
          local_2640._4_4_ = context->user->instPrimID[0];
          local_2640._0_4_ = local_2640._4_4_;
          local_2640._8_4_ = local_2640._4_4_;
          local_2640._12_4_ = local_2640._4_4_;
          local_2640._16_4_ = local_2640._4_4_;
          local_2640._20_4_ = local_2640._4_4_;
          local_2640._24_4_ = local_2640._4_4_;
          local_2640._28_4_ = local_2640._4_4_;
          local_2c80 = *(undefined1 (*) [32])(ray + 0x100);
          auVar67 = vblendvps_avx(local_2c80,local_2920,auVar74);
          *(undefined1 (*) [32])(ray + 0x100) = auVar67;
          local_2c30.valid = (int *)local_2bc0;
          local_2c30.geometryUserPtr = unaff_R15->userPtr;
          local_2c30.context = context->user;
          local_2c30.hit = (RTCHitN *)&local_2740;
          local_2c30.N = 8;
          local_2c30.ray = (RTCRayN *)ray;
          local_2bc0 = auVar74;
          if (unaff_R15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_2be0._0_8_ = pGVar55;
            local_2ca0._0_8_ = pGVar57;
            auVar74 = ZEXT1632(auVar79._0_16_);
            auVar114 = ZEXT1664(auVar16);
            auVar119 = ZEXT1664(auVar118._0_16_);
            auVar124 = ZEXT1664(auVar123._0_16_);
            (*unaff_R15->occlusionFilterN)(&local_2c30);
            auVar79 = vpcmpeqd_avx2(auVar74,auVar74);
            auVar137 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            auVar134 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar133 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            pGVar55 = (Geometry *)local_2be0._0_8_;
            uVar56 = local_2d30;
            context = local_2d28;
            pGVar57 = (Geometry *)local_2ca0._0_8_;
          }
          auVar74 = vpcmpeqd_avx2(local_2bc0,_DAT_01faff00);
          auVar67 = auVar79 & ~auVar74;
          if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar67 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar67 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar67 >> 0x7f,0) == '\0') &&
                (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar67 >> 0xbf,0) == '\0') &&
              (auVar67 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar67[0x1f]) {
            auVar74 = auVar74 ^ auVar79;
          }
          else {
            p_Var6 = context->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((unaff_R15->field_8).field_0x2 & 0x40) != 0))))
            {
              local_2ca0._0_8_ = pGVar57;
              auVar114 = ZEXT1664(auVar114._0_16_);
              auVar119 = ZEXT1664(auVar119._0_16_);
              auVar124 = ZEXT1664(auVar124._0_16_);
              (*p_Var6)(&local_2c30);
              auVar137 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              auVar134 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar133 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              uVar56 = local_2d30;
              context = local_2d28;
              pGVar57 = (Geometry *)local_2ca0._0_8_;
              unaff_R15 = pGVar55;
            }
            auVar67 = vpcmpeqd_avx2(local_2bc0,_DAT_01faff00);
            auVar74 = auVar67 ^ _DAT_01fe9960;
            auVar95._8_4_ = 0xff800000;
            auVar95._0_8_ = 0xff800000ff800000;
            auVar95._12_4_ = 0xff800000;
            auVar95._16_4_ = 0xff800000;
            auVar95._20_4_ = 0xff800000;
            auVar95._24_4_ = 0xff800000;
            auVar95._28_4_ = 0xff800000;
            auVar67 = vblendvps_avx(auVar95,*(undefined1 (*) [32])(local_2c30.ray + 0x100),auVar67);
            *(undefined1 (*) [32])(local_2c30.ray + 0x100) = auVar67;
          }
          auVar67 = vblendvps_avx(local_2c80,*(undefined1 (*) [32])local_2ce8,auVar74);
          *(undefined1 (*) [32])local_2ce8 = auVar67;
          ray = local_2d38;
        }
        auVar74 = vandnps_avx(auVar74,local_2ce0);
        lVar51 = (long)local_2d20;
      }
      if (((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              SUB321(auVar74 >> 0x7f,0) == '\0') &&
             (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            SUB321(auVar74 >> 0xbf,0) == '\0') &&
           (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar74[0x1f]
          ) || (bVar60 = 2 < uVar54, uVar54 = uVar54 + 1, bVar60)) break;
    }
    auVar75 = vandps_avx(auVar74,local_2c00);
    auVar74 = local_2c00 & auVar74;
    auVar67 = local_2c00;
    if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar74 >> 0x7f,0) == '\0') &&
          (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar74 >> 0xbf,0) == '\0') &&
        (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar74[0x1f])
    break;
  }
  auVar74 = vpcmpeqd_avx2(auVar67,auVar67);
  local_2c60._0_4_ = auVar75._0_4_ ^ auVar74._0_4_;
  local_2c60._4_4_ = auVar75._4_4_ ^ auVar74._4_4_;
  local_2c60._8_4_ = auVar75._8_4_ ^ auVar74._8_4_;
  local_2c60._12_4_ = auVar75._12_4_ ^ auVar74._12_4_;
  local_2c60._16_4_ = auVar75._16_4_ ^ auVar74._16_4_;
  local_2c60._20_4_ = auVar75._20_4_ ^ auVar74._20_4_;
  local_2c60._24_4_ = auVar75._24_4_ ^ auVar74._24_4_;
  local_2c60._28_4_ = auVar75._28_4_ ^ auVar74._28_4_;
  auVar67 = local_29a0;
LAB_019ce416:
  local_2c60 = vorps_avx(auVar67,local_2c60);
  auVar74 = auVar74 & ~local_2c60;
  if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar74 >> 0x7f,0) == '\0') &&
        (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar74 >> 0xbf,0) == '\0') &&
      (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar74[0x1f])
  goto LAB_019ce532;
  auVar96._8_4_ = 0xff800000;
  auVar96._0_8_ = 0xff800000ff800000;
  auVar96._12_4_ = 0xff800000;
  auVar96._16_4_ = 0xff800000;
  auVar96._20_4_ = 0xff800000;
  auVar96._24_4_ = 0xff800000;
  auVar96._28_4_ = 0xff800000;
  local_29e0 = vblendvps_avx(local_29e0,auVar96,local_2c60);
  goto LAB_019cd96c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }